

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

void Bac_PtrFree(Vec_Ptr_t *vDes)

{
  long lVar1;
  
  if (vDes != (Vec_Ptr_t *)0x0) {
    if (1 < vDes->nSize) {
      lVar1 = 1;
      do {
        Bac_PtrFreeNtk((Vec_Ptr_t *)vDes->pArray[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < vDes->nSize);
    }
    if (vDes->pArray != (void **)0x0) {
      free(vDes->pArray);
    }
    free(vDes);
    return;
  }
  return;
}

Assistant:

void Bac_PtrFree( Vec_Ptr_t * vDes )
{
    Vec_Ptr_t * vNtk; int i;
    if ( !vDes ) return;
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Bac_PtrFreeNtk( vNtk );
    Vec_PtrFree( vDes );
}